

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_common.hpp
# Opt level: O0

void __thiscall
afsm::test::transit_action::operator()
          (transit_action *this,none *param_1,
          inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
          *param_2,prepare *src,parse *tgt)

{
  ansi_color val;
  ostream *poVar1;
  string local_88 [48];
  string local_58 [36];
  int local_34;
  parse *local_30;
  parse *tgt_local;
  prepare *src_local;
  inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
  *param_2_local;
  none *param_1_local;
  transit_action *this_local;
  
  local_30 = tgt;
  tgt_local = (parse *)src;
  src_local = (prepare *)param_2;
  param_2_local =
       (inner_state_machine<afsm::test::connection_fsm_def::transaction::extended_query,_afsm::inner_state_machine<afsm::test::connection_fsm_def::transaction,_afsm::state_machine<afsm::test::connection_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>_>_>
        *)param_1;
  param_1_local = (none *)this;
  val = psst::operator|(red,bright);
  poVar1 = psst::operator<<((ostream *)&std::cerr,val);
  local_34 = (int)std::setw(0x11);
  poVar1 = std::operator<<(poVar1,(_Setw)local_34);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::left);
  poVar1 = std::operator<<(poVar1,"[default]");
  poVar1 = psst::operator<<(poVar1,clear);
  poVar1 = std::operator<<(poVar1,": ");
  (*(tgt_local->super_state<parse>).super_common_base<afsm::test::state_name>.super_state_name.
    _vptr_state_name[2])();
  poVar1 = std::operator<<(poVar1,local_58);
  poVar1 = std::operator<<(poVar1," -> ");
  (*(local_30->super_state<parse>).super_common_base<afsm::test::state_name>.super_state_name.
    _vptr_state_name[2])(local_88);
  poVar1 = std::operator<<(poVar1,local_88);
  std::operator<<(poVar1,"\n");
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_58);
  return;
}

Assistant:

void
    operator()(none&&, FSM&, SourceState& src, TargetState& tgt) const
    {
        using ::psst::ansi_color;
        ::std::cerr
                << (ansi_color::red | ansi_color::bright)
                << ::std::setw(event_name_width) << ::std::left
                << "[default]" << ansi_color::clear
                << ": " << src.name() << " -> " << tgt.name() << "\n";
    }